

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnits_Test::
~Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnits_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnits_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnits)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr iu = libcellml::Units::create("per_fmol");
    iu->setImportSource(import);
    iu->setImportReference("per_fmol");

    libcellml::UnitsPtr u = libcellml::Units::create("fmol");
    u->addUnit("mole", "femto");
    model->addUnits(iu);
    model->addUnits(u);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(2), flatModel->unitsCount());
    EXPECT_EQ("per_fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol", flatModel->units(1)->name());
}